

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::FileDescriptorProto::SharedDtor(FileDescriptorProto *this)

{
  string *psVar1;
  pointer pcVar2;
  
  psVar1 = (this->name_).ptr_;
  if (psVar1 != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if ((psVar1 != (string *)0x0) &&
       (pcVar2 = (psVar1->_M_dataplus)._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar2 != &psVar1->field_2)) {
      operator_delete(pcVar2);
    }
    operator_delete(psVar1);
  }
  psVar1 = (this->package_).ptr_;
  if (psVar1 != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if ((psVar1 != (string *)0x0) &&
       (pcVar2 = (psVar1->_M_dataplus)._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar2 != &psVar1->field_2)) {
      operator_delete(pcVar2);
    }
    operator_delete(psVar1);
  }
  psVar1 = (this->syntax_).ptr_;
  if (psVar1 != (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if ((psVar1 != (string *)0x0) &&
       (pcVar2 = (psVar1->_M_dataplus)._M_p,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)pcVar2 != &psVar1->field_2)) {
      operator_delete(pcVar2);
    }
    operator_delete(psVar1);
  }
  if (this != (FileDescriptorProto *)_FileDescriptorProto_default_instance_) {
    if (this->options_ != (FileOptions *)0x0) {
      (*(this->options_->super_Message).super_MessageLite._vptr_MessageLite[1])();
    }
    if (this->source_code_info_ != (SourceCodeInfo *)0x0) {
      (*(this->source_code_info_->super_Message).super_MessageLite._vptr_MessageLite[1])();
      return;
    }
  }
  return;
}

Assistant:

void FileDescriptorProto::SharedDtor() {
  GOOGLE_DCHECK(GetArenaNoVirtual() == nullptr);
  name_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  package_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  syntax_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (this != internal_default_instance()) delete options_;
  if (this != internal_default_instance()) delete source_code_info_;
}